

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O3

void recompute_ideal_colors_2planes
               (image_block *blk,block_size_descriptor *bsd,decimation_info *di,
               uint8_t *dec_weights_uquant_plane1,uint8_t *dec_weights_uquant_plane2,endpoints *ep,
               vfloat4 *rgbs_vector,vfloat4 *rgbo_vector,int plane2_component)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  uint i_1;
  uint i;
  ulong uVar12;
  float fVar13;
  float fVar25;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar56;
  float fVar58;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar26;
  float fVar44;
  float fVar45;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  float fVar55;
  float fVar57;
  float fVar59;
  undefined1 in_ZMM2 [64];
  float fVar60;
  undefined1 auVar61 [16];
  float fVar68;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 in_ZMM3 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 in_ZMM4 [64];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar83;
  float fVar84;
  undefined1 auVar82 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM8 [64];
  float fVar98;
  float fVar102;
  float fVar103;
  undefined1 auVar99 [16];
  float fVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar106 [16];
  float fVar110;
  undefined1 auVar111 [16];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  float dec_weight_plane2 [32];
  float dec_weight_plane1 [32];
  float undec_weight_plane2 [216];
  float undec_weight_plane1 [216];
  float local_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8d0 [8];
  float fStack_8c8;
  float fStack_8c4;
  float local_8b0;
  undefined1 local_8a0 [16];
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  float local_870;
  float local_820 [32];
  float local_7a0 [32];
  float local_720 [216];
  float local_3c0 [230];
  
  uVar10 = (ulong)blk->texel_count;
  if (uVar10 == 0) {
    __assert_fail("total_texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x567,
                  "void recompute_ideal_colors_2planes(const image_block &, const block_size_descriptor &, const decimation_info &, const uint8_t *, const uint8_t *, endpoints &, vfloat4 &, vfloat4 &, int)"
                 );
  }
  bVar3 = di->weight_count;
  if ((ulong)bVar3 == 0) {
    __assert_fail("weight_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x568,
                  "void recompute_ideal_colors_2planes(const image_block &, const block_size_descriptor &, const decimation_info &, const uint8_t *, const uint8_t *, endpoints &, vfloat4 &, vfloat4 &, int)"
                 );
  }
  if (0x20 < bVar3) {
    __assert_fail("weight_count <= BLOCK_MAX_WEIGHTS_2PLANE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x56d,
                  "void recompute_ideal_colors_2planes(const image_block &, const block_size_descriptor &, const decimation_info &, const uint8_t *, const uint8_t *, endpoints &, vfloat4 &, vfloat4 &, int)"
                 );
  }
  uVar12 = 0;
  do {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(dec_weights_uquant_plane1 + uVar12);
    auVar5 = vpmovzxbd_avx2(auVar15);
    auVar5 = vcvtdq2ps_avx(auVar5);
    local_7a0[uVar12] = auVar5._0_4_ * 0.015625;
    local_7a0[uVar12 + 1] = auVar5._4_4_ * 0.015625;
    local_7a0[uVar12 + 2] = auVar5._8_4_ * 0.015625;
    local_7a0[uVar12 + 3] = auVar5._12_4_ * 0.015625;
    local_7a0[uVar12 + 4] = auVar5._16_4_ * 0.015625;
    local_7a0[uVar12 + 5] = auVar5._20_4_ * 0.015625;
    local_7a0[uVar12 + 6] = auVar5._24_4_ * 0.015625;
    local_7a0[uVar12 + 7] = auVar5._28_4_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *(ulong *)(dec_weights_uquant_plane2 + uVar12);
    auVar5 = vpmovzxbd_avx2(auVar52);
    auVar5 = vcvtdq2ps_avx(auVar5);
    auVar53._4_4_ = auVar5._4_4_ * 0.015625;
    auVar53._0_4_ = auVar5._0_4_ * 0.015625;
    auVar53._8_4_ = auVar5._8_4_ * 0.015625;
    auVar53._12_4_ = auVar5._12_4_ * 0.015625;
    auVar53._16_4_ = auVar5._16_4_ * 0.015625;
    auVar53._20_4_ = auVar5._20_4_ * 0.015625;
    auVar53._24_4_ = auVar5._24_4_ * 0.015625;
    auVar53._28_4_ = auVar5._28_4_;
    *(undefined1 (*) [32])(local_820 + uVar12) = auVar53;
    uVar12 = uVar12 + 8;
  } while (uVar12 < bVar3);
  if (di->max_texel_weight_count == 1) {
    pfVar9 = local_7a0;
    pfVar11 = local_820;
  }
  else {
    uVar12 = 0;
    if (di->max_texel_weight_count < 3) {
      pfVar9 = local_3c0;
      pfVar11 = local_720;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(di->texel_weights_tr[0] + uVar12);
        auVar54 = vpmovzxbd_avx2(auVar4);
        auVar5 = vpcmpeqd_avx2(auVar53,auVar53);
        auVar53 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar5);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(di->texel_weights_tr[1] + uVar12);
        auVar6 = vpmovzxbd_avx2(auVar2);
        auVar5 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
        auVar75 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar5);
        auVar5 = *(undefined1 (*) [32])(di->texel_weight_contribs_float_tr[0] + uVar12);
        in_ZMM3 = ZEXT3264(auVar5);
        pfVar1 = di->texel_weight_contribs_float_tr[1] + uVar12;
        fVar13 = *pfVar1;
        fVar44 = pfVar1[1];
        fVar25 = pfVar1[2];
        fVar45 = pfVar1[3];
        fVar112 = pfVar1[4];
        fVar56 = pfVar1[5];
        fVar58 = pfVar1[6];
        auVar76._0_4_ = auVar53._0_4_ * auVar5._0_4_ + auVar75._0_4_ * fVar13;
        auVar76._4_4_ = auVar53._4_4_ * auVar5._4_4_ + auVar75._4_4_ * fVar44;
        auVar76._8_4_ = auVar53._8_4_ * auVar5._8_4_ + auVar75._8_4_ * fVar25;
        auVar76._12_4_ = auVar53._12_4_ * auVar5._12_4_ + auVar75._12_4_ * fVar45;
        auVar76._16_4_ = auVar53._16_4_ * auVar5._16_4_ + auVar75._16_4_ * fVar112;
        auVar76._20_4_ = auVar53._20_4_ * auVar5._20_4_ + auVar75._20_4_ * fVar56;
        auVar76._24_4_ = auVar53._24_4_ * auVar5._24_4_ + auVar75._24_4_ * fVar58;
        auVar76._28_4_ = auVar53._28_4_ + auVar75._28_4_;
        *(undefined1 (*) [32])(local_3c0 + uVar12) = auVar76;
        auVar53 = vpcmpeqd_avx2(auVar76,auVar76);
        auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar53);
        auVar53 = vpcmpeqd_avx2(auVar54,auVar54);
        auVar54 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
        fVar13 = fVar13 * auVar54._0_4_;
        fVar44 = fVar44 * auVar54._4_4_;
        auVar53._4_4_ = fVar44;
        auVar53._0_4_ = fVar13;
        fVar25 = fVar25 * auVar54._8_4_;
        auVar53._8_4_ = fVar25;
        fVar45 = fVar45 * auVar54._12_4_;
        auVar53._12_4_ = fVar45;
        fVar112 = fVar112 * auVar54._16_4_;
        auVar53._16_4_ = fVar112;
        fVar56 = fVar56 * auVar54._20_4_;
        auVar53._20_4_ = fVar56;
        fVar58 = fVar58 * auVar54._24_4_;
        auVar53._24_4_ = fVar58;
        auVar53._28_4_ = auVar6._28_4_;
        local_720[uVar12] = auVar5._0_4_ * auVar76._0_4_ + fVar13;
        local_720[uVar12 + 1] = auVar5._4_4_ * auVar76._4_4_ + fVar44;
        local_720[uVar12 + 2] = auVar5._8_4_ * auVar76._8_4_ + fVar25;
        local_720[uVar12 + 3] = auVar5._12_4_ * auVar76._12_4_ + fVar45;
        local_720[uVar12 + 4] = auVar5._16_4_ * auVar76._16_4_ + fVar112;
        local_720[uVar12 + 5] = auVar5._20_4_ * auVar76._20_4_ + fVar56;
        local_720[uVar12 + 6] = auVar5._24_4_ * auVar76._24_4_ + fVar58;
        local_720[uVar12 + 7] = auVar6._28_4_ + 0.0;
        uVar12 = uVar12 + 8;
      } while (uVar12 < uVar10);
    }
    else {
      pfVar9 = local_3c0;
      pfVar11 = local_720;
      do {
        auVar101._8_8_ = 0;
        auVar101._0_8_ = *(ulong *)(di->texel_weights_tr[0] + uVar12);
        vpmovzxbd_avx2(auVar101);
        auVar5 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
        auVar106._8_8_ = 0;
        auVar106._0_8_ = *(ulong *)(di->texel_weights_tr[1] + uVar12);
        auVar54 = vpmovzxbd_avx2(auVar106);
        auVar53 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar5);
        auVar5 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
        auVar76 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar5);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = *(ulong *)(di->texel_weights_tr[2] + uVar12);
        auVar6 = vpmovzxbd_avx2(auVar64);
        auVar5 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
        auVar82 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar5);
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)(di->texel_weights_tr[3] + uVar12);
        auVar5 = vpmovzxbd_avx2(auVar97);
        in_ZMM6 = ZEXT3264(auVar5);
        auVar5 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
        auVar94 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar5);
        auVar5 = *(undefined1 (*) [32])(di->texel_weight_contribs_float_tr[0] + uVar12);
        in_ZMM8 = ZEXT3264(auVar5);
        pfVar1 = di->texel_weight_contribs_float_tr[1] + uVar12;
        fVar13 = *pfVar1;
        fVar44 = pfVar1[1];
        fVar25 = pfVar1[2];
        fVar45 = pfVar1[3];
        fVar112 = pfVar1[4];
        fVar56 = pfVar1[5];
        fVar58 = pfVar1[6];
        pfVar1 = di->texel_weight_contribs_float_tr[2] + uVar12;
        fVar60 = *pfVar1;
        fVar110 = pfVar1[1];
        fVar68 = pfVar1[2];
        fVar67 = pfVar1[3];
        fVar55 = pfVar1[4];
        fVar104 = pfVar1[5];
        fVar98 = pfVar1[6];
        pfVar1 = di->texel_weight_contribs_float_tr[3] + uVar12;
        fVar102 = *pfVar1;
        fVar103 = pfVar1[1];
        fVar105 = pfVar1[2];
        fVar107 = pfVar1[3];
        fVar108 = pfVar1[4];
        fVar109 = pfVar1[5];
        fVar59 = pfVar1[6];
        auVar75._0_4_ = fVar60 * auVar82._0_4_ + fVar102 * auVar94._0_4_;
        auVar75._4_4_ = fVar110 * auVar82._4_4_ + fVar103 * auVar94._4_4_;
        auVar75._8_4_ = fVar68 * auVar82._8_4_ + fVar105 * auVar94._8_4_;
        auVar75._12_4_ = fVar67 * auVar82._12_4_ + fVar107 * auVar94._12_4_;
        auVar75._16_4_ = fVar55 * auVar82._16_4_ + fVar108 * auVar94._16_4_;
        auVar75._20_4_ = fVar104 * auVar82._20_4_ + fVar109 * auVar94._20_4_;
        auVar75._24_4_ = fVar98 * auVar82._24_4_ + fVar59 * auVar94._24_4_;
        auVar75._28_4_ = auVar76._28_4_ + auVar82._28_4_;
        local_3c0[uVar12] = auVar5._0_4_ * auVar53._0_4_ + fVar13 * auVar76._0_4_ + auVar75._0_4_;
        local_3c0[uVar12 + 1] =
             auVar5._4_4_ * auVar53._4_4_ + fVar44 * auVar76._4_4_ + auVar75._4_4_;
        local_3c0[uVar12 + 2] =
             auVar5._8_4_ * auVar53._8_4_ + fVar25 * auVar76._8_4_ + auVar75._8_4_;
        local_3c0[uVar12 + 3] =
             auVar5._12_4_ * auVar53._12_4_ + fVar45 * auVar76._12_4_ + auVar75._12_4_;
        local_3c0[uVar12 + 4] =
             auVar5._16_4_ * auVar53._16_4_ + fVar112 * auVar76._16_4_ + auVar75._16_4_;
        local_3c0[uVar12 + 5] =
             auVar5._20_4_ * auVar53._20_4_ + fVar56 * auVar76._20_4_ + auVar75._20_4_;
        local_3c0[uVar12 + 6] =
             auVar5._24_4_ * auVar53._24_4_ + fVar58 * auVar76._24_4_ + auVar75._24_4_;
        local_3c0[uVar12 + 7] = auVar53._28_4_ + auVar76._28_4_ + auVar75._28_4_;
        auVar53 = vpcmpeqd_avx2(auVar75,auVar75);
        auVar75 = vgatherdps(ZEXT432(0) << 0x20,auVar53);
        auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar53);
        auVar53 = vpcmpeqd_avx2(auVar54,auVar54);
        auVar54 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
        auVar53 = vpcmpeqd_avx2(auVar6,auVar6);
        auVar53 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
        in_ZMM4 = ZEXT3264((undefined1  [32])0x0);
        fVar102 = fVar102 * auVar53._0_4_;
        fVar103 = fVar103 * auVar53._4_4_;
        fVar105 = fVar105 * auVar53._8_4_;
        fVar107 = fVar107 * auVar53._12_4_;
        fVar108 = fVar108 * auVar53._16_4_;
        fVar109 = fVar109 * auVar53._20_4_;
        fVar59 = fVar59 * auVar53._24_4_;
        in_ZMM2 = ZEXT3264(CONCAT428(auVar54._28_4_,
                                     CONCAT424(fVar59,CONCAT420(fVar109,CONCAT416(fVar108,CONCAT412(
                                                  fVar107,CONCAT48(fVar105,CONCAT44(fVar103,fVar102)
                                                                  )))))));
        local_720[uVar12] =
             auVar5._0_4_ * auVar75._0_4_ + fVar13 * auVar76._0_4_ +
             fVar60 * auVar54._0_4_ + fVar102;
        local_720[uVar12 + 1] =
             auVar5._4_4_ * auVar75._4_4_ + fVar44 * auVar76._4_4_ +
             fVar110 * auVar54._4_4_ + fVar103;
        local_720[uVar12 + 2] =
             auVar5._8_4_ * auVar75._8_4_ + fVar25 * auVar76._8_4_ +
             fVar68 * auVar54._8_4_ + fVar105;
        local_720[uVar12 + 3] =
             auVar5._12_4_ * auVar75._12_4_ + fVar45 * auVar76._12_4_ +
             fVar67 * auVar54._12_4_ + fVar107;
        local_720[uVar12 + 4] =
             auVar5._16_4_ * auVar75._16_4_ + fVar112 * auVar76._16_4_ +
             fVar55 * auVar54._16_4_ + fVar108;
        local_720[uVar12 + 5] =
             auVar5._20_4_ * auVar75._20_4_ + fVar56 * auVar76._20_4_ +
             fVar104 * auVar54._20_4_ + fVar109;
        local_720[uVar12 + 6] =
             auVar5._24_4_ * auVar75._24_4_ + fVar58 * auVar76._24_4_ +
             fVar98 * auVar54._24_4_ + fVar59;
        local_720[uVar12 + 7] = auVar75._28_4_ + auVar76._28_4_ + auVar75._28_4_ + auVar54._28_4_;
        uVar12 = uVar12 + 8;
      } while (uVar12 < uVar10);
    }
  }
  bVar3 = bsd->texel_count;
  fVar13 = (float)bVar3;
  auVar15 = *(undefined1 (*) [16])(blk->channel_weight).m;
  fVar44 = auVar15._0_4_;
  auVar69._0_4_ = fVar44 * fVar13;
  fVar25 = auVar15._4_4_;
  auVar69._4_4_ = fVar25 * fVar13;
  fVar45 = auVar15._8_4_;
  auVar69._8_4_ = fVar45 * fVar13;
  fVar112 = auVar15._12_4_;
  auVar69._12_4_ = fVar112 * fVar13;
  auVar90 = ZEXT816(0) << 0x40;
  auVar52 = vblendps_avx(auVar90,*(undefined1 (*) [16])(blk->data_mean).m,7);
  auVar27._0_4_ = auVar52._0_4_ * auVar52._0_4_;
  auVar27._4_4_ = auVar52._4_4_ * auVar52._4_4_;
  auVar27._8_4_ = auVar52._8_4_ * auVar52._8_4_;
  auVar27._12_4_ = auVar52._12_4_ * auVar52._12_4_;
  auVar101 = vshufpd_avx(auVar27,auVar27,1);
  auVar28._0_4_ = auVar27._0_4_ + auVar101._0_4_;
  auVar28._4_4_ = auVar27._4_4_ + auVar101._4_4_;
  auVar28._8_4_ = auVar27._8_4_ + auVar101._8_4_;
  auVar28._12_4_ = auVar27._12_4_ + auVar101._12_4_;
  auVar101 = vhaddps_avx(auVar28,auVar28);
  auVar96._8_4_ = 0x233877aa;
  auVar96._0_8_ = 0x233877aa233877aa;
  auVar96._12_4_ = 0x233877aa;
  auVar29._0_4_ = auVar101._0_4_;
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_4_ = auVar29._0_4_;
  auVar29._12_4_ = auVar29._0_4_;
  auVar101 = vsqrtps_avx(auVar29);
  auVar52 = vdivps_avx(auVar52,auVar101);
  auVar14._4_4_ = plane2_component;
  auVar14._0_4_ = plane2_component;
  auVar14._8_4_ = plane2_component;
  auVar14._12_4_ = plane2_component;
  auVar101 = vpcmpeqd_avx(auVar14,_DAT_002773b0);
  auVar15 = vhaddps_avx(auVar15,auVar15);
  fVar110 = (blk->channel_weight).m[2] + auVar15._0_4_;
  auVar7 = ZEXT812(0) << 0x20;
  fVar13 = auVar52._0_4_;
  fVar56 = auVar52._4_4_;
  fVar58 = auVar52._8_4_;
  fVar60 = auVar52._12_4_;
  if ((ulong)bVar3 == 0) {
    auVar15 = SUB6416(ZEXT464(0x501502f9),0);
    _local_900 = ZEXT416(0) << 0x20;
    local_8d0._0_4_ = 0.0;
    local_8d0._4_4_ = 0.0;
    fStack_8c8 = 0.0;
    fStack_8c4 = 0.0;
    fVar67 = 0.0;
    local_870 = 0.0;
    auVar52 = SUB6416(ZEXT864(0),0);
    local_904 = 1.0;
    auVar43 = ZEXT1664(SUB6416(ZEXT464(0x3f800000),0));
    local_8a0 = ZEXT816(0);
    auVar61 = ZEXT816(0);
    auVar46 = auVar96;
    local_880 = local_870;
    local_8b0 = local_870;
    fVar68 = fVar67;
  }
  else {
    _local_8d0 = ZEXT816(0) << 0x20;
    auVar46._8_4_ = 1e-17;
    auVar46._0_8_ = 0x233877aa233877aa;
    auVar46._12_4_ = 1e-17;
    auVar114 = ZEXT464(0x3f800000);
    auVar24 = ZEXT464(0x501502f9);
    local_8a0 = ZEXT416(0) << 0x20;
    uVar10 = 0;
    auVar43 = ZEXT1664(auVar114._0_16_);
    local_8b0 = 0.0;
    local_880 = 0.0;
    fVar55 = 0.0;
    fVar68 = 0.0;
    local_870 = 0.0;
    fVar67 = 0.0;
    _local_900 = ZEXT416(0) << 0x20;
    auVar106 = ZEXT816(0) << 0x20;
    do {
      auVar15 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar10]),ZEXT416((uint)blk->data_g[uVar10]),
                              0x10);
      auVar52 = vinsertps_avx(auVar15,ZEXT416((uint)blk->data_b[uVar10]),0x20);
      auVar47._0_4_ = fVar13 * auVar52._0_4_;
      auVar47._4_4_ = fVar56 * auVar52._4_4_;
      auVar47._8_4_ = fVar58 * auVar52._8_4_;
      auVar47._12_4_ = fVar60 * auVar52._12_4_;
      auVar15 = vhaddps_avx(auVar47,auVar47);
      fVar104 = pfVar9[uVar10];
      auVar85._4_4_ = fVar104;
      auVar85._0_4_ = fVar104;
      auVar85._8_4_ = fVar104;
      auVar85._12_4_ = fVar104;
      fVar102 = 1.0 - fVar104;
      auVar64 = vshufpd_avx(auVar47,auVar47,1);
      fVar98 = auVar64._0_4_ + auVar15._0_4_;
      local_8b0 = local_8b0 + fVar102 * fVar102;
      local_880 = local_880 + fVar104 * fVar102;
      fVar55 = fVar55 + fVar104 * fVar104;
      fVar104 = pfVar11[uVar10];
      auVar78._4_4_ = fVar104;
      auVar78._0_4_ = fVar104;
      auVar78._8_4_ = fVar104;
      auVar78._12_4_ = fVar104;
      fVar103 = 1.0 - fVar104;
      auVar15 = vblendps_avx(auVar78,auVar85,2);
      auVar106 = vmaxps_avx(auVar15,auVar106);
      fVar68 = fVar68 + fVar103 * fVar103;
      auVar15 = vinsertps_avx(auVar52,ZEXT416((uint)blk->data_a[uVar10]),0x30);
      auVar4 = vminss_avx(auVar78,auVar114._0_16_);
      auVar114 = ZEXT1664(auVar4);
      local_870 = local_870 + fVar103 * fVar104;
      auVar64 = vblendvps_avx(auVar85,auVar78,auVar101);
      fVar67 = fVar67 + fVar104 * fVar104;
      auVar99._0_4_ = auVar15._0_4_ * auVar64._0_4_;
      auVar99._4_4_ = auVar15._4_4_ * auVar64._4_4_;
      auVar99._8_4_ = auVar15._8_4_ * auVar64._8_4_;
      auVar99._12_4_ = auVar15._12_4_ * auVar64._12_4_;
      local_900._4_4_ = (float)local_900._4_4_ + auVar99._4_4_;
      local_900._0_4_ = (float)local_900._0_4_ + auVar99._0_4_;
      fStack_8f8 = fStack_8f8 + auVar99._8_4_;
      fStack_8f4 = fStack_8f4 + auVar99._12_4_;
      auVar15 = vsubps_avx(auVar15,auVar99);
      auVar52 = ZEXT416((uint)fVar55);
      local_8d0._0_4_ = (float)local_8d0._0_4_ + auVar15._0_4_;
      local_8d0._4_4_ = (float)local_8d0._4_4_ + auVar15._4_4_;
      fStack_8c8 = fStack_8c8 + auVar15._8_4_;
      fStack_8c4 = fStack_8c4 + auVar15._12_4_;
      auVar15 = vminss_avx(auVar85,auVar43._0_16_);
      auVar43 = ZEXT1664(auVar15);
      auVar97 = vinsertps_avx(ZEXT416((uint)fVar102),auVar85,0x1c);
      local_8e0 = auVar90._0_4_;
      fStack_8dc = auVar90._4_4_;
      fStack_8d8 = auVar90._8_4_;
      fStack_8d4 = auVar90._12_4_;
      auVar15 = vminss_avx(ZEXT416((uint)fVar98),auVar24._0_16_);
      auVar24 = ZEXT1664(auVar15);
      local_8a0 = vmaxss_avx(ZEXT416((uint)fVar98),local_8a0);
      fVar98 = fVar110 * fVar98;
      auVar90._0_4_ = local_8e0 + auVar97._0_4_ * fVar98;
      auVar90._4_4_ = fStack_8dc + auVar97._4_4_ * fVar98;
      auVar90._8_4_ = fStack_8d8 + auVar97._8_4_ * fVar98;
      auVar90._12_4_ = fStack_8d4 + auVar97._12_4_ * fVar98;
      local_890 = auVar46._0_4_;
      fStack_88c = auVar46._4_4_;
      fStack_888 = auVar46._8_4_;
      fStack_884 = auVar46._12_4_;
      auVar46._0_4_ = local_890 + auVar64._0_4_;
      auVar46._4_4_ = fStack_88c + auVar64._4_4_;
      auVar46._8_4_ = fStack_888 + auVar64._8_4_;
      auVar46._12_4_ = fStack_884 + auVar64._12_4_;
      uVar10 = uVar10 + 1;
    } while (bVar3 != uVar10);
    local_904 = auVar4._0_4_;
    auVar61._0_4_ = auVar106._0_4_ * 0.999;
    auVar61._4_4_ = auVar106._4_4_ * 0.999;
    auVar61._8_4_ = auVar106._8_4_ * 0.999;
    auVar61._12_4_ = auVar106._12_4_ * 0.999;
    auVar96._8_4_ = 0x233877aa;
    auVar96._0_8_ = 0x233877aa233877aa;
    auVar96._12_4_ = 0x233877aa;
    auVar7 = ZEXT812(0);
  }
  auVar8._12_4_ = 0;
  auVar8._0_12_ = auVar7;
  auVar106 = vmaxps_avx(auVar69,auVar96);
  fVar104 = auVar52._0_4_;
  fVar98 = fVar44 * fVar104;
  fVar102 = fVar25 * fVar104;
  fVar103 = fVar45 * fVar104;
  fVar104 = fVar112 * fVar104;
  fVar105 = (float)local_8d0._0_4_ * fVar44;
  fVar107 = (float)local_8d0._4_4_ * fVar25;
  fVar108 = fStack_8c8 * fVar45;
  fVar109 = fStack_8c4 * fVar112;
  auVar64 = vmaxss_avx(local_8a0,ZEXT416(0x2edbe6ff));
  auVar70._0_4_ = auVar15._0_4_ / auVar64._0_4_;
  auVar70._4_12_ = auVar15._4_12_;
  auVar64 = vmaxss_avx(auVar70,auVar8 << 0x20);
  auVar15 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar70,1);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar15 = vblendvps_avx(auVar64,auVar111,auVar15);
  auVar113._0_4_ = fVar44 * (float)local_900._0_4_;
  auVar113._4_4_ = fVar25 * (float)local_900._4_4_;
  auVar113._8_4_ = fVar45 * fStack_8f8;
  auVar113._12_4_ = fVar112 * fStack_8f4;
  fVar55 = local_8a0._0_4_;
  auVar16._0_4_ = fVar13 * fVar55;
  auVar16._4_4_ = fVar56 * fVar55;
  auVar16._8_4_ = fVar58 * fVar55;
  auVar16._12_4_ = fVar60 * fVar55;
  auVar15 = vinsertps_avx(auVar16,auVar15,0x30);
  *(undefined1 (*) [16])rgbs_vector->m = auVar15;
  auVar15 = vmovshdup_avx(auVar61);
  local_8d0._4_4_ = fVar102;
  local_8d0._0_4_ = fVar98;
  fStack_8c8 = fVar103;
  fStack_8c4 = fVar104;
  if (auVar15._0_4_ <= auVar43._0_4_) {
    auVar33._0_4_ = auVar113._0_4_ + fVar105;
    auVar33._4_4_ = auVar113._4_4_ + fVar107;
    auVar33._8_4_ = auVar113._8_4_ + fVar108;
    auVar33._12_4_ = auVar113._12_4_ + fVar109;
    auVar64 = vdivps_avx(auVar33,auVar106);
    auVar15 = vcmpps_avx(auVar64,ZEXT416(0) << 0x20,7);
    auVar15 = vandnps_avx(auVar101,auVar15);
    auVar52 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt0[0].m,auVar64,auVar15);
    auVar15 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt1[0].m,auVar64,auVar15);
    *(undefined1 (*) [16])ep->endpt0[0].m = auVar52;
    *(undefined1 (*) [16])ep->endpt1[0].m = auVar15;
    auVar15 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
  }
  else {
    auVar48._4_4_ = local_880;
    auVar48._0_4_ = local_880;
    auVar48._8_4_ = local_880;
    auVar48._12_4_ = local_880;
    auVar71._4_4_ = local_8b0;
    auVar71._0_4_ = local_8b0;
    auVar71._8_4_ = local_8b0;
    auVar71._12_4_ = local_8b0;
    auVar15 = vblendps_avx(auVar71,auVar48,2);
    auVar15 = vinsertps_avx(auVar15,auVar52,0x20);
    auVar17._0_4_ = fVar110 * auVar15._0_4_;
    auVar17._4_4_ = fVar110 * auVar15._4_4_;
    auVar17._8_4_ = fVar110 * auVar15._8_4_;
    auVar17._12_4_ = fVar110 * auVar15._12_4_;
    fVar110 = fVar44 * local_880;
    fVar55 = fVar25 * local_880;
    fVar57 = fVar45 * local_880;
    local_880 = fVar112 * local_880;
    fVar77 = fVar44 * local_8b0;
    fVar83 = fVar25 * local_8b0;
    fVar84 = fVar45 * local_8b0;
    local_8b0 = fVar112 * local_8b0;
    auVar30._0_4_ = fVar98 * fVar77;
    auVar30._4_4_ = fVar102 * fVar83;
    auVar30._8_4_ = fVar103 * fVar84;
    auVar30._12_4_ = fVar104 * local_8b0;
    auVar72._0_4_ = fVar110 * fVar110;
    auVar72._4_4_ = fVar55 * fVar55;
    auVar72._8_4_ = fVar57 * fVar57;
    auVar72._12_4_ = local_880 * local_880;
    auVar52 = vsubps_avx(auVar30,auVar72);
    auVar15 = vshufpd_avx(auVar17,auVar17,1);
    fVar26 = auVar15._0_4_;
    auVar15 = vmovshdup_avx(auVar17);
    fVar95 = auVar15._0_4_;
    fVar59 = auVar17._0_4_ * fVar26 - fVar95 * fVar95;
    auVar91._0_4_ = fVar105 * fVar98;
    auVar91._4_4_ = fVar107 * fVar102;
    auVar91._8_4_ = fVar108 * fVar103;
    auVar91._12_4_ = fVar109 * fVar104;
    auVar100._0_4_ = auVar113._0_4_ * fVar110;
    auVar100._4_4_ = auVar113._4_4_ * fVar55;
    auVar100._8_4_ = auVar113._8_4_ * fVar57;
    auVar100._12_4_ = auVar113._12_4_ * local_880;
    auVar64 = vsubps_avx(auVar91,auVar100);
    auVar79._0_4_ = auVar113._0_4_ * fVar77;
    auVar79._4_4_ = auVar113._4_4_ * fVar83;
    auVar79._8_4_ = auVar113._8_4_ * fVar84;
    auVar79._12_4_ = auVar113._12_4_ * local_8b0;
    auVar49._0_4_ = fVar105 * fVar110;
    auVar49._4_4_ = fVar107 * fVar55;
    auVar49._8_4_ = fVar108 * fVar57;
    auVar49._12_4_ = fVar109 * local_880;
    auVar97 = vsubps_avx(auVar79,auVar49);
    auVar15 = vdivps_avx(auVar111,auVar52);
    auVar92._0_4_ = auVar64._0_4_ * auVar15._0_4_;
    auVar92._4_4_ = auVar64._4_4_ * auVar15._4_4_;
    auVar92._8_4_ = auVar64._8_4_ * auVar15._8_4_;
    auVar92._12_4_ = auVar64._12_4_ * auVar15._12_4_;
    auVar50._0_4_ = auVar97._0_4_ * auVar15._0_4_;
    auVar50._4_4_ = auVar97._4_4_ * auVar15._4_4_;
    auVar50._8_4_ = auVar97._8_4_ * auVar15._8_4_;
    auVar50._12_4_ = auVar97._12_4_ * auVar15._12_4_;
    auVar15 = vsubps_avx(ZEXT816(0) << 0x20,auVar52);
    auVar15 = vmaxps_avx(auVar15,auVar52);
    auVar86._0_4_ = (fVar98 * fVar98 + fVar77 * fVar77 + fVar110 * (fVar110 + fVar110)) * 0.0001;
    auVar86._4_4_ = (fVar102 * fVar102 + fVar83 * fVar83 + fVar55 * (fVar55 + fVar55)) * 0.0001;
    auVar86._8_4_ = (fVar103 * fVar103 + fVar84 * fVar84 + fVar57 * (fVar57 + fVar57)) * 0.0001;
    auVar86._12_4_ =
         (fVar104 * fVar104 + local_8b0 * local_8b0 + local_880 * (local_880 + local_880)) * 0.0001;
    auVar15 = vcmpps_avx(auVar86,auVar15,1);
    auVar52 = vcmpps_avx(auVar92,auVar50,7);
    auVar15 = vandps_avx(auVar52,auVar15);
    auVar15 = vandnps_avx(auVar101,auVar15);
    auVar52 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt0[0].m,auVar92,auVar15);
    auVar15 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt1[0].m,auVar50,auVar15);
    auVar64 = vmovshdup_avx(auVar90);
    fVar55 = 1.0 / fVar59;
    fVar110 = fVar55 * (auVar90._0_4_ * fVar26 - fVar95 * auVar64._0_4_);
    fVar55 = fVar55 * (auVar64._0_4_ * auVar17._0_4_ - auVar90._0_4_ * fVar95);
    *(undefined1 (*) [16])ep->endpt0[0].m = auVar52;
    *(undefined1 (*) [16])ep->endpt1[0].m = auVar15;
    if (((fVar55 <= fVar110) || (NAN(fVar55) || NAN(fVar110))) ||
       (auVar31._8_4_ = 0x7fffffff, auVar31._0_8_ = 0x7fffffff7fffffff, auVar31._12_4_ = 0x7fffffff,
       auVar15 = vandps_avx(ZEXT416((uint)fVar59),auVar31),
       auVar15._0_4_ <=
       (fVar26 * fVar26 + auVar17._0_4_ * auVar17._0_4_ + fVar95 * (fVar95 + fVar95)) * 0.0001))
    goto LAB_0026df8f;
    auVar32._0_4_ = fVar55 * fVar13;
    auVar32._4_4_ = fVar55 * fVar56;
    auVar32._8_4_ = fVar55 * fVar58;
    auVar32._12_4_ = fVar55 * fVar60;
    auVar15 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar110 / fVar55)),0x30);
  }
  *(undefined1 (*) [16])rgbs_vector->m = auVar15;
LAB_0026df8f:
  auVar18._0_4_ = fVar44 * fVar67;
  auVar18._4_4_ = fVar25 * fVar67;
  auVar18._8_4_ = fVar45 * fVar67;
  auVar18._12_4_ = fVar112 * fVar67;
  local_900._0_4_ = auVar61._0_4_;
  if ((float)local_900._0_4_ <= local_904) {
    auVar38._0_4_ = auVar113._0_4_ + fVar105;
    auVar38._4_4_ = auVar113._4_4_ + fVar107;
    auVar38._8_4_ = auVar113._8_4_ + fVar108;
    auVar38._12_4_ = auVar113._12_4_ + fVar109;
    auVar37 = vdivps_avx(auVar38,auVar106);
    auVar15 = vcmpps_avx(auVar37,ZEXT816(0) << 0x40,7);
    auVar63 = auVar37;
  }
  else {
    fVar60 = fVar44 * fVar68;
    fVar110 = fVar25 * fVar68;
    fVar67 = fVar45 * fVar68;
    fVar68 = fVar112 * fVar68;
    fVar13 = fVar44 * local_870;
    fVar56 = fVar25 * local_870;
    fVar58 = fVar45 * local_870;
    local_870 = fVar112 * local_870;
    auVar34._0_4_ = auVar18._0_4_ * fVar60;
    auVar34._4_4_ = auVar18._4_4_ * fVar110;
    auVar34._8_4_ = auVar18._8_4_ * fVar67;
    auVar34._12_4_ = auVar18._12_4_ * fVar68;
    auVar73._0_4_ = fVar13 * fVar13;
    auVar73._4_4_ = fVar56 * fVar56;
    auVar73._8_4_ = fVar58 * fVar58;
    auVar73._12_4_ = local_870 * local_870;
    auVar52 = vsubps_avx(auVar34,auVar73);
    auVar35._8_4_ = 0x3f800000;
    auVar35._0_8_ = 0x3f8000003f800000;
    auVar35._12_4_ = 0x3f800000;
    auVar15 = vdivps_avx(auVar35,auVar52);
    auVar36._0_4_ = fVar105 * auVar18._0_4_;
    auVar36._4_4_ = fVar107 * auVar18._4_4_;
    auVar36._8_4_ = fVar108 * auVar18._8_4_;
    auVar36._12_4_ = fVar109 * auVar18._12_4_;
    auVar93._0_4_ = auVar113._0_4_ * fVar13;
    auVar93._4_4_ = auVar113._4_4_ * fVar56;
    auVar93._8_4_ = auVar113._8_4_ * fVar58;
    auVar93._12_4_ = auVar113._12_4_ * local_870;
    auVar64 = vsubps_avx(auVar36,auVar93);
    auVar37._0_4_ = auVar64._0_4_ * auVar15._0_4_;
    auVar37._4_4_ = auVar64._4_4_ * auVar15._4_4_;
    auVar37._8_4_ = auVar64._8_4_ * auVar15._8_4_;
    auVar37._12_4_ = auVar64._12_4_ * auVar15._12_4_;
    auVar62._0_4_ = auVar113._0_4_ * fVar60;
    auVar62._4_4_ = auVar113._4_4_ * fVar110;
    auVar62._8_4_ = auVar113._8_4_ * fVar67;
    auVar62._12_4_ = auVar113._12_4_ * fVar68;
    auVar51._0_4_ = fVar105 * fVar13;
    auVar51._4_4_ = fVar107 * fVar56;
    auVar51._8_4_ = fVar108 * fVar58;
    auVar51._12_4_ = fVar109 * local_870;
    auVar64 = vsubps_avx(auVar62,auVar51);
    auVar63._0_4_ = auVar64._0_4_ * auVar15._0_4_;
    auVar63._4_4_ = auVar64._4_4_ * auVar15._4_4_;
    auVar63._8_4_ = auVar64._8_4_ * auVar15._8_4_;
    auVar63._12_4_ = auVar64._12_4_ * auVar15._12_4_;
    auVar15 = vsubps_avx(ZEXT816(0) << 0x20,auVar52);
    auVar15 = vmaxps_avx(auVar15,auVar52);
    auVar74._0_4_ =
         (auVar18._0_4_ * auVar18._0_4_ + fVar60 * fVar60 + fVar13 * (fVar13 + fVar13)) * 0.0001;
    auVar74._4_4_ =
         (auVar18._4_4_ * auVar18._4_4_ + fVar110 * fVar110 + fVar56 * (fVar56 + fVar56)) * 0.0001;
    auVar74._8_4_ =
         (auVar18._8_4_ * auVar18._8_4_ + fVar67 * fVar67 + fVar58 * (fVar58 + fVar58)) * 0.0001;
    auVar74._12_4_ =
         (auVar18._12_4_ * auVar18._12_4_ + fVar68 * fVar68 + local_870 * (local_870 + local_870)) *
         0.0001;
    auVar15 = vcmpps_avx(auVar74,auVar15,1);
    auVar52 = vcmpps_avx(auVar37,auVar63,7);
    auVar15 = vandps_avx(auVar52,auVar15);
  }
  auVar15 = vandps_avx(auVar101,auVar15);
  auVar52 = vpslld_avx(auVar15,0x1f);
  auVar15 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt0[0].m,auVar37,auVar52);
  *(undefined1 (*) [16])ep->endpt0[0].m = auVar15;
  auVar15 = vblendvps_avx(*(undefined1 (*) [16])ep->endpt1[0].m,auVar63,auVar52);
  *(undefined1 (*) [16])ep->endpt1[0].m = auVar15;
  if (blk->alpha_lns[0] != '\0' || blk->rgb_lns[0] != '\0') {
    auVar15 = vpcmpeqd_avx(auVar14,_DAT_0032c6c0);
    auVar15 = vblendvps_avx(_local_8d0,auVar18,auVar15);
    auVar19._0_4_ = fVar44 * auVar15._0_4_;
    auVar19._4_4_ = fVar25 * auVar15._4_4_;
    auVar19._8_4_ = fVar45 * auVar15._8_4_;
    auVar19._12_4_ = fVar112 * auVar15._12_4_;
    auVar15 = vhaddps_avx(auVar19,auVar19);
    local_890 = auVar46._0_4_;
    fStack_88c = auVar46._4_4_;
    fStack_888 = auVar46._8_4_;
    fStack_884 = auVar46._12_4_;
    auVar87._0_4_ = fVar44 * local_890;
    auVar87._4_4_ = fVar25 * fStack_88c;
    auVar87._8_4_ = fVar45 * fStack_888;
    auVar87._12_4_ = fVar112 * fStack_884;
    auVar52 = vshufpd_avx(auVar19,auVar19,1);
    fVar13 = auVar52._0_4_ + auVar15._0_4_;
    auVar20._0_4_ = auVar113._0_4_ + fVar105;
    auVar20._4_4_ = auVar113._4_4_ + fVar107;
    auVar20._8_4_ = auVar113._8_4_ + fVar108;
    auVar20._12_4_ = auVar113._12_4_ + fVar109;
    auVar15 = vhaddps_avx(auVar113,auVar113);
    auVar52 = vshufpd_avx(auVar113,auVar113,1);
    auVar39._0_4_ = auVar52._0_4_ + auVar15._0_4_;
    auVar39._4_4_ = auVar52._4_4_ + auVar15._4_4_;
    auVar39._8_4_ = auVar52._8_4_ + auVar15._8_4_;
    auVar39._12_4_ = auVar52._12_4_ + auVar15._12_4_;
    auVar15 = vinsertps_avx(auVar20,auVar39,0x30);
    auVar52 = vmovshdup_avx(auVar106);
    auVar64 = vshufpd_avx(auVar106,auVar106,1);
    auVar101 = vmovshdup_avx(auVar87);
    auVar97 = vshufpd_avx(auVar87,auVar87,1);
    fVar60 = auVar101._0_4_;
    fVar110 = auVar97._0_4_;
    fVar56 = auVar64._0_4_;
    fVar25 = fVar56 * fVar13 - fVar110 * fVar110;
    fVar58 = auVar52._0_4_;
    fVar45 = fVar25 * fVar58 - fVar56 * fVar60 * fVar60;
    fVar68 = auVar106._0_4_;
    fVar44 = fVar58 * auVar87._0_4_ * -fVar56;
    fVar112 = 1.0 / (auVar87._0_4_ * fVar44 + fVar68 * fVar45);
    auVar101 = ZEXT416((uint)(fVar60 * fVar56 * auVar87._0_4_));
    auVar52 = vinsertps_avx(ZEXT416((uint)fVar45),auVar101,0x10);
    auVar101 = vinsertps_avx(auVar101,ZEXT416((uint)(fVar25 * fVar68 -
                                                    fVar56 * auVar87._0_4_ * auVar87._0_4_)),0x10);
    auVar64 = ZEXT416((uint)(fVar110 * fVar58 * auVar87._0_4_));
    auVar52 = vinsertps_avx(auVar52,auVar64,0x20);
    auVar106 = ZEXT416((uint)(fVar110 * fVar68 * fVar60));
    auVar101 = vinsertps_avx(auVar101,auVar106,0x20);
    auVar106 = vinsertps_avx(auVar64,auVar106,0x10);
    auVar106 = vinsertps_avx(auVar106,ZEXT416((uint)(fVar68 * (fVar58 * fVar13 - fVar60 * fVar60) -
                                                    fVar58 * auVar87._0_4_ * auVar87._0_4_)),0x20);
    auVar52 = vinsertps_avx(auVar52,ZEXT416((uint)fVar44),0x30);
    auVar64 = ZEXT416((uint)(fVar68 * fVar60 * -fVar56));
    auVar101 = vinsertps_avx(auVar101,auVar64,0x30);
    local_900._0_4_ = auVar15._0_4_;
    local_900._4_4_ = auVar15._4_4_;
    fStack_8f8 = auVar15._8_4_;
    fStack_8f4 = auVar15._12_4_;
    fVar13 = fVar112 * (float)local_900._0_4_;
    fVar25 = fVar112 * (float)local_900._4_4_;
    fStack_8f8 = fVar112 * fStack_8f8;
    fVar112 = fVar112 * fStack_8f4;
    auVar80._0_4_ = auVar52._0_4_ * fVar13;
    auVar80._4_4_ = auVar52._4_4_ * fVar25;
    auVar80._8_4_ = auVar52._8_4_ * fStack_8f8;
    auVar80._12_4_ = auVar52._12_4_ * fVar112;
    auVar15 = vshufpd_avx(auVar80,auVar80,1);
    auVar81._0_4_ = auVar80._0_4_ + auVar15._0_4_;
    auVar81._4_4_ = auVar80._4_4_ + auVar15._4_4_;
    auVar81._8_4_ = auVar80._8_4_ + auVar15._8_4_;
    auVar81._12_4_ = auVar80._12_4_ + auVar15._12_4_;
    auVar88._0_4_ = auVar101._0_4_ * fVar13;
    auVar88._4_4_ = auVar101._4_4_ * fVar25;
    auVar88._8_4_ = auVar101._8_4_ * fStack_8f8;
    auVar88._12_4_ = auVar101._12_4_ * fVar112;
    auVar15 = vshufpd_avx(auVar88,auVar88,1);
    auVar89._0_4_ = auVar88._0_4_ + auVar15._0_4_;
    auVar89._4_4_ = auVar88._4_4_ + auVar15._4_4_;
    auVar89._8_4_ = auVar88._8_4_ + auVar15._8_4_;
    auVar89._12_4_ = auVar88._12_4_ + auVar15._12_4_;
    auVar15 = vhaddps_avx(auVar81,auVar89);
    auVar97 = ZEXT416((uint)(-fVar110 * fVar58 * fVar68));
    auVar52 = vinsertps_avx(auVar106,auVar97,0x30);
    auVar101 = vinsertps_avx(ZEXT416((uint)fVar44),auVar64,0x10);
    auVar65._0_4_ = auVar52._0_4_ * fVar13;
    auVar65._4_4_ = auVar52._4_4_ * fVar25;
    auVar65._8_4_ = auVar52._8_4_ * fStack_8f8;
    auVar65._12_4_ = auVar52._12_4_ * fVar112;
    auVar52 = vshufpd_avx(auVar65,auVar65,1);
    auVar66._0_4_ = auVar65._0_4_ + auVar52._0_4_;
    auVar66._4_4_ = auVar65._4_4_ + auVar52._4_4_;
    auVar66._8_4_ = auVar65._8_4_ + auVar52._8_4_;
    auVar66._12_4_ = auVar65._12_4_ + auVar52._12_4_;
    auVar52 = vhaddps_avx(auVar66,auVar66);
    auVar101 = vinsertps_avx(auVar101,auVar97,0x20);
    auVar101 = vinsertps_avx(auVar101,ZEXT416((uint)(fVar56 * fVar58 * fVar68)),0x30);
    auVar21._0_4_ = auVar101._0_4_ * fVar13;
    auVar21._4_4_ = auVar101._4_4_ * fVar25;
    auVar21._8_4_ = auVar101._8_4_ * fStack_8f8;
    auVar21._12_4_ = auVar101._12_4_ * fVar112;
    auVar101 = vshufpd_avx(auVar21,auVar21,1);
    auVar22._0_4_ = auVar21._0_4_ + auVar101._0_4_;
    auVar22._4_4_ = auVar21._4_4_ + auVar101._4_4_;
    auVar22._8_4_ = auVar21._8_4_ + auVar101._8_4_;
    auVar22._12_4_ = auVar21._12_4_ + auVar101._12_4_;
    auVar101 = vhaddps_avx(auVar22,auVar22);
    auVar15 = vshufps_avx(auVar15,auVar52,0x48);
    auVar52 = vinsertps_avx(auVar15,auVar101,0x30);
    auVar40._0_4_ = auVar52._0_4_ * auVar52._0_4_;
    auVar40._4_4_ = auVar52._4_4_ * auVar52._4_4_;
    auVar40._8_4_ = auVar52._8_4_ * auVar52._8_4_;
    auVar40._12_4_ = auVar52._12_4_ * auVar52._12_4_;
    auVar15 = vshufpd_avx(auVar40,auVar40,1);
    auVar41._0_4_ = auVar40._0_4_ + auVar15._0_4_;
    auVar41._4_4_ = auVar40._4_4_ + auVar15._4_4_;
    auVar41._8_4_ = auVar40._8_4_ + auVar15._8_4_;
    auVar41._12_4_ = auVar40._12_4_ + auVar15._12_4_;
    auVar15 = vhaddps_avx(auVar41,auVar41);
    *(undefined1 (*) [16])rgbo_vector->m = auVar52;
    if (NAN(auVar15._0_4_)) {
      auVar15 = *(undefined1 (*) [16])ep->endpt0[0].m;
      auVar52 = *(undefined1 (*) [16])ep->endpt1[0].m;
      auVar106 = vsubps_avx(auVar52,auVar15);
      auVar101 = vhaddps_avx(auVar106,auVar106);
      auVar106 = vshufpd_avx(auVar106,auVar106,1);
      auVar101 = vmaxss_avx(ZEXT416((uint)((auVar106._0_4_ + auVar101._0_4_) * 0.33333334)),
                            ZEXT816(0) << 0x20);
      auVar23._0_4_ = (auVar15._0_4_ + auVar52._0_4_) * 0.5;
      auVar23._4_4_ = (auVar15._4_4_ + auVar52._4_4_) * 0.5;
      auVar23._8_4_ = (auVar15._8_4_ + auVar52._8_4_) * 0.5;
      auVar23._12_4_ = (auVar15._12_4_ + auVar52._12_4_) * 0.5;
      fVar13 = auVar101._0_4_ * 0.5;
      auVar42._4_4_ = fVar13;
      auVar42._0_4_ = fVar13;
      auVar42._8_4_ = fVar13;
      auVar42._12_4_ = fVar13;
      auVar15 = vsubps_avx(auVar23,auVar42);
      auVar15 = vinsertps_avx(auVar15,auVar101,0x30);
      *(undefined1 (*) [16])rgbo_vector->m = auVar15;
    }
  }
  return;
}

Assistant:

void recompute_ideal_colors_2planes(
	const image_block& blk,
	const block_size_descriptor& bsd,
	const decimation_info& di,
	const uint8_t* dec_weights_uquant_plane1,
	const uint8_t* dec_weights_uquant_plane2,
	endpoints& ep,
	vfloat4& rgbs_vector,
	vfloat4& rgbo_vector,
	int plane2_component
) {
	unsigned int weight_count = di.weight_count;
	unsigned int total_texel_count = blk.texel_count;

	promise(total_texel_count > 0);
	promise(weight_count > 0);

	ASTCENC_ALIGNAS float dec_weight_plane1[BLOCK_MAX_WEIGHTS_2PLANE];
	ASTCENC_ALIGNAS float dec_weight_plane2[BLOCK_MAX_WEIGHTS_2PLANE];

	assert(weight_count <= BLOCK_MAX_WEIGHTS_2PLANE);

	for (unsigned int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
	{
		vint unquant_value1(dec_weights_uquant_plane1 + i);
		vfloat unquant_value1f = int_to_float(unquant_value1) * vfloat(1.0f / 64.0f);
		storea(unquant_value1f, dec_weight_plane1 + i);

		vint unquant_value2(dec_weights_uquant_plane2 + i);
		vfloat unquant_value2f = int_to_float(unquant_value2) * vfloat(1.0f / 64.0f);
		storea(unquant_value2f, dec_weight_plane2 + i);
	}

	ASTCENC_ALIGNAS float undec_weight_plane1[BLOCK_MAX_TEXELS];
	ASTCENC_ALIGNAS float undec_weight_plane2[BLOCK_MAX_TEXELS];

	float* undec_weight_plane1_ref;
	float* undec_weight_plane2_ref;

	if (di.max_texel_weight_count == 1)
	{
		undec_weight_plane1_ref = dec_weight_plane1;
		undec_weight_plane2_ref = dec_weight_plane2;
	}
	else if (di.max_texel_weight_count <= 2)
	{
		for (unsigned int i = 0; i < total_texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat weight = bilinear_infill_vla_2(di, dec_weight_plane1, i);
			storea(weight, undec_weight_plane1 + i);

			weight = bilinear_infill_vla_2(di, dec_weight_plane2, i);
			storea(weight, undec_weight_plane2 + i);
		}

		undec_weight_plane1_ref = undec_weight_plane1;
		undec_weight_plane2_ref = undec_weight_plane2;
	}
	else
	{
		for (unsigned int i = 0; i < total_texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat weight = bilinear_infill_vla(di, dec_weight_plane1, i);
			storea(weight, undec_weight_plane1 + i);

			weight = bilinear_infill_vla(di, dec_weight_plane2, i);
			storea(weight, undec_weight_plane2 + i);
		}

		undec_weight_plane1_ref = undec_weight_plane1;
		undec_weight_plane2_ref = undec_weight_plane2;
	}

	unsigned int texel_count = bsd.texel_count;
	vfloat4 rgba_weight_sum = max(blk.channel_weight * static_cast<float>(texel_count), 1e-17f);
	vfloat4 scale_dir = normalize(blk.data_mean.swz<0, 1, 2>());

	float scale_max = 0.0f;
	float scale_min = 1e10f;

	float wmin1 = 1.0f;
	float wmax1 = 0.0f;

	float wmin2 = 1.0f;
	float wmax2 = 0.0f;

	float left1_sum_s = 0.0f;
	float middle1_sum_s = 0.0f;
	float right1_sum_s = 0.0f;

	float left2_sum_s = 0.0f;
	float middle2_sum_s = 0.0f;
	float right2_sum_s = 0.0f;

	vfloat4 color_vec_x = vfloat4::zero();
	vfloat4 color_vec_y = vfloat4::zero();

	vfloat4 scale_vec = vfloat4::zero();

	vfloat4 weight_weight_sum = vfloat4(1e-17f);

	vmask4 p2_mask = vint4::lane_id() == vint4(plane2_component);
	vfloat4 color_weight = blk.channel_weight;
	float ls_weight = hadd_rgb_s(color_weight);

	for (unsigned int j = 0; j < texel_count; j++)
	{
		vfloat4 rgba = blk.texel(j);

		float idx0 = undec_weight_plane1_ref[j];

		float om_idx0 = 1.0f - idx0;
		wmin1 = astc::min(idx0, wmin1);
		wmax1 = astc::max(idx0, wmax1);

		float scale = dot3_s(scale_dir, rgba);
		scale_min = astc::min(scale, scale_min);
		scale_max = astc::max(scale, scale_max);

		left1_sum_s   += om_idx0 * om_idx0;
		middle1_sum_s += om_idx0 * idx0;
		right1_sum_s  += idx0 * idx0;

		float idx1 = undec_weight_plane2_ref[j];

		float om_idx1 = 1.0f - idx1;
		wmin2 = astc::min(idx1, wmin2);
		wmax2 = astc::max(idx1, wmax2);

		left2_sum_s   += om_idx1 * om_idx1;
		middle2_sum_s += om_idx1 * idx1;
		right2_sum_s  += idx1 * idx1;

		vfloat4 color_idx = select(vfloat4(idx0), vfloat4(idx1), p2_mask);

		vfloat4 cwprod = rgba;
		vfloat4 cwiprod = cwprod * color_idx;

		color_vec_y += cwiprod;
		color_vec_x += cwprod - cwiprod;

		scale_vec += vfloat2(om_idx0, idx0) * (ls_weight * scale);
		weight_weight_sum += color_idx;
	}

	vfloat4 left1_sum   = vfloat4(left1_sum_s) * color_weight;
	vfloat4 middle1_sum = vfloat4(middle1_sum_s) * color_weight;
	vfloat4 right1_sum  = vfloat4(right1_sum_s) * color_weight;
	vfloat4 lmrs_sum    = vfloat3(left1_sum_s, middle1_sum_s, right1_sum_s) * ls_weight;

	vfloat4 left2_sum   = vfloat4(left2_sum_s) * color_weight;
	vfloat4 middle2_sum = vfloat4(middle2_sum_s) * color_weight;
	vfloat4 right2_sum  = vfloat4(right2_sum_s) * color_weight;

	color_vec_x = color_vec_x * color_weight;
	color_vec_y = color_vec_y * color_weight;

	// Initialize the luminance and scale vectors with a reasonable default
	float scalediv = scale_min / astc::max(scale_max, 1e-10f);
	scalediv = astc::clamp1f(scalediv);

	vfloat4 sds = scale_dir * scale_max;

	rgbs_vector = vfloat4(sds.lane<0>(), sds.lane<1>(), sds.lane<2>(), scalediv);

	if (wmin1 >= wmax1 * 0.999f)
	{
		// If all weights in the partition were equal, then just take average of all colors in
		// the partition and use that as both endpoint colors
		vfloat4 avg = (color_vec_x + color_vec_y) / rgba_weight_sum;

		vmask4 p1_mask = vint4::lane_id() != vint4(plane2_component);
		vmask4 notnan_mask = avg == avg;
		vmask4 full_mask = p1_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], avg, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], avg, full_mask);

		rgbs_vector = vfloat4(sds.lane<0>(), sds.lane<1>(), sds.lane<2>(), 1.0f);
	}
	else
	{
		// Otherwise, complete the analytic calculation of ideal-endpoint-values for the given
		// set of texel weights and pixel colors
		vfloat4 color_det1 = (left1_sum * right1_sum) - (middle1_sum * middle1_sum);
		vfloat4 color_rdet1 = 1.0f / color_det1;

		float ls_det1  = (lmrs_sum.lane<0>() * lmrs_sum.lane<2>()) - (lmrs_sum.lane<1>() * lmrs_sum.lane<1>());
		float ls_rdet1 = 1.0f / ls_det1;

		vfloat4 color_mss1 = (left1_sum * left1_sum)
		                   + (2.0f * middle1_sum * middle1_sum)
		                   + (right1_sum * right1_sum);

		float ls_mss1 = (lmrs_sum.lane<0>() * lmrs_sum.lane<0>())
		              + (2.0f * lmrs_sum.lane<1>() * lmrs_sum.lane<1>())
		              + (lmrs_sum.lane<2>() * lmrs_sum.lane<2>());

		vfloat4 ep0 = (right1_sum * color_vec_x - middle1_sum * color_vec_y) * color_rdet1;
		vfloat4 ep1 = (left1_sum * color_vec_y - middle1_sum * color_vec_x) * color_rdet1;

		float scale_ep0 = (lmrs_sum.lane<2>() * scale_vec.lane<0>() - lmrs_sum.lane<1>() * scale_vec.lane<1>()) * ls_rdet1;
		float scale_ep1 = (lmrs_sum.lane<0>() * scale_vec.lane<1>() - lmrs_sum.lane<1>() * scale_vec.lane<0>()) * ls_rdet1;

		vmask4 p1_mask = vint4::lane_id() != vint4(plane2_component);
		vmask4 det_mask = abs(color_det1) > (color_mss1 * 1e-4f);
		vmask4 notnan_mask = (ep0 == ep0) & (ep1 == ep1);
		vmask4 full_mask = p1_mask & det_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], ep0, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], ep1, full_mask);

		if (fabsf(ls_det1) > (ls_mss1 * 1e-4f) && scale_ep0 == scale_ep0 && scale_ep1 == scale_ep1 && scale_ep0 < scale_ep1)
		{
			float scalediv2 = scale_ep0 / scale_ep1;
			vfloat4 sdsm = scale_dir * scale_ep1;
			rgbs_vector = vfloat4(sdsm.lane<0>(), sdsm.lane<1>(), sdsm.lane<2>(), scalediv2);
		}
	}

	if (wmin2 >= wmax2 * 0.999f)
	{
		// If all weights in the partition were equal, then just take average of all colors in
		// the partition and use that as both endpoint colors
		vfloat4 avg = (color_vec_x + color_vec_y) / rgba_weight_sum;

		vmask4 notnan_mask = avg == avg;
		vmask4 full_mask = p2_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], avg, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], avg, full_mask);
	}
	else
	{
		// Otherwise, complete the analytic calculation of ideal-endpoint-values for the given
		// set of texel weights and pixel colors
		vfloat4 color_det2 = (left2_sum * right2_sum) - (middle2_sum * middle2_sum);
		vfloat4 color_rdet2 = 1.0f / color_det2;

		vfloat4 color_mss2 = (left2_sum * left2_sum)
		                   + (2.0f * middle2_sum * middle2_sum)
		                   + (right2_sum * right2_sum);

		vfloat4 ep0 = (right2_sum * color_vec_x - middle2_sum * color_vec_y) * color_rdet2;
		vfloat4 ep1 = (left2_sum * color_vec_y - middle2_sum * color_vec_x) * color_rdet2;

		vmask4 det_mask = abs(color_det2) > (color_mss2 * 1e-4f);
		vmask4 notnan_mask = (ep0 == ep0) & (ep1 == ep1);
		vmask4 full_mask = p2_mask & det_mask & notnan_mask;

		ep.endpt0[0] = select(ep.endpt0[0], ep0, full_mask);
		ep.endpt1[0] = select(ep.endpt1[0], ep1, full_mask);
	}

	// Calculations specific to mode #7, the HDR RGB-scale mode - skip if known LDR
	if (blk.rgb_lns[0] || blk.alpha_lns[0])
	{
		weight_weight_sum = weight_weight_sum * color_weight;
		float psum = dot3_s(select(right1_sum, right2_sum, p2_mask), color_weight);

		vfloat4 rgbq_sum = color_vec_x + color_vec_y;
		rgbq_sum.set_lane<3>(hadd_rgb_s(color_vec_y));

		rgbo_vector = compute_rgbo_vector(rgba_weight_sum, weight_weight_sum, rgbq_sum, psum);

		// We can get a failure due to the use of a singular (non-invertible) matrix
		// If it failed, compute rgbo_vectors[] with a different method ...
		if (astc::isnan(dot_s(rgbo_vector, rgbo_vector)))
		{
			vfloat4 v0 = ep.endpt0[0];
			vfloat4 v1 = ep.endpt1[0];

			float avgdif = hadd_rgb_s(v1 - v0) * (1.0f / 3.0f);
			avgdif = astc::max(avgdif, 0.0f);

			vfloat4 avg = (v0 + v1) * 0.5f;
			vfloat4 ep0 = avg - vfloat4(avgdif) * 0.5f;

			rgbo_vector = vfloat4(ep0.lane<0>(), ep0.lane<1>(), ep0.lane<2>(), avgdif);
		}
	}
}